

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O2

void mtree_quote(archive_string *s,char *str)

{
  byte bVar1;
  ulong in_RAX;
  byte *pbVar2;
  byte *_p;
  undefined4 uStack_38;
  char buf [4];
  
  pbVar2 = (byte *)str;
  _p = (byte *)str;
  _uStack_38 = in_RAX;
  while( true ) {
    bVar1 = *pbVar2;
    if ((ulong)bVar1 == 0) break;
    if (""[bVar1] == '\0') {
      if (pbVar2 != _p) {
        archive_strncat(s,_p,(long)str - (long)_p);
        bVar1 = *pbVar2;
      }
      _uStack_38 = CONCAT14(0x5c,uStack_38);
      _uStack_38 = CONCAT17(bVar1,CONCAT16(bVar1 >> 3,CONCAT15(bVar1 >> 6,_uStack_38))) &
                   0x707ffffffffffff | 0x3030300000000000;
      archive_strncat(s,buf,4);
      _p = pbVar2 + 1;
    }
    pbVar2 = pbVar2 + 1;
    str = str + 1;
  }
  if (pbVar2 != _p) {
    archive_strncat(s,_p,(long)str - (long)_p);
  }
  return;
}

Assistant:

static void
mtree_quote(struct archive_string *s, const char *str)
{
	const char *start;
	char buf[4];
	unsigned char c;

	for (start = str; *str != '\0'; ++str) {
		if (safe_char[*(const unsigned char *)str])
			continue;
		if (start != str)
			archive_strncat(s, start, str - start);
		c = (unsigned char)*str;
		buf[0] = '\\';
		buf[1] = (c / 64) + '0';
		buf[2] = (c / 8 % 8) + '0';
		buf[3] = (c % 8) + '0';
		archive_strncat(s, buf, 4);
		start = str + 1;
	}

	if (start != str)
		archive_strncat(s, start, str - start);
}